

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterSPH.cpp
# Opt level: O3

void __thiscall chrono::ChMatterSPH::SetNoSpeedNoAcceleration(ChMatterSPH *this)

{
  element_type *peVar1;
  undefined8 uVar2;
  double dVar3;
  double dVar4;
  pointer psVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  
  dVar4 = DAT_00b689a8;
  dVar3 = DAT_00b689a0;
  uVar2 = VNULL;
  psVar5 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)(this->nodes).
                super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)psVar5;
  if (lVar6 != 0) {
    uVar7 = 1;
    do {
      peVar1 = (psVar5->super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (peVar1 != (element_type *)0xb68978) {
        ((ChVector<double> *)((long)&peVar1->super_ChNodeXYZ + 0x20))->m_data[0] = (double)uVar2;
        *(double *)((long)&peVar1->super_ChNodeXYZ + 0x28) = dVar3;
        *(double *)((long)&peVar1->super_ChNodeXYZ + 0x30) = dVar4;
      }
      if (peVar1 != (element_type *)0xb68960) {
        ((ChVector<double> *)((long)&peVar1->super_ChNodeXYZ + 0x38))->m_data[0] = (double)uVar2;
        *(double *)((long)&peVar1->super_ChNodeXYZ + 0x40) = dVar3;
        *(double *)((long)&peVar1->super_ChNodeXYZ + 0x48) = dVar4;
      }
      uVar8 = (ulong)uVar7;
      psVar5 = psVar5 + 1;
      uVar7 = uVar7 + 1;
    } while (uVar8 < (ulong)(lVar6 >> 4));
  }
  return;
}

Assistant:

void ChMatterSPH::SetNoSpeedNoAcceleration() {
    for (unsigned int j = 0; j < nodes.size(); j++) {
        nodes[j]->SetPos_dt(VNULL);
        nodes[j]->SetPos_dtdt(VNULL);
    }
}